

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O3

void RigidBodyDynamics::Math::SparseFactorizeLTL(Model *model,MatrixNd *H)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar3 = _DAT_0018a220;
  auVar2 = _DAT_0018a210;
  uVar10 = (ulong)model->qdot_size;
  if (uVar10 != 0) {
    pdVar4 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar5 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    uVar6 = model->qdot_size - 2;
    pdVar8 = pdVar4 + lVar5;
    pdVar4 = pdVar4 + lVar5 * 2;
    uVar13 = 0;
    uVar11 = uVar6;
    do {
      uVar9 = uVar13 + 1;
      if (uVar9 < uVar10) {
        uVar7 = uVar6 - (int)uVar13;
        auVar15._4_4_ = 0;
        auVar15._0_4_ = uVar7;
        auVar15._8_4_ = uVar7;
        auVar15._12_4_ = 0;
        auVar15 = auVar15 ^ auVar3;
        lVar12 = 0;
        uVar13 = 0;
        do {
          auVar16._8_4_ = (int)uVar13;
          auVar16._0_8_ = uVar13;
          auVar16._12_4_ = (int)(uVar13 >> 0x20);
          auVar16 = (auVar16 | auVar2) ^ auVar3;
          if ((bool)(~(auVar15._4_4_ < auVar16._4_4_ ||
                      auVar15._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar15._4_4_) & 1)) {
            *(undefined8 *)((long)pdVar8 + lVar12) = 0;
          }
          if (auVar16._12_4_ <= auVar15._12_4_ &&
              (auVar16._8_4_ <= auVar15._8_4_ || auVar16._12_4_ != auVar15._12_4_)) {
            *(undefined8 *)((long)pdVar4 + lVar12) = 0;
          }
          uVar13 = uVar13 + 2;
          lVar12 = lVar12 + lVar5 * 0x10;
        } while (((ulong)uVar11 + 2 & 0xfffffffffffffffe) != uVar13);
      }
      uVar11 = uVar11 - 1;
      pdVar8 = pdVar8 + lVar5 + 1;
      pdVar4 = pdVar4 + lVar5 + 1;
      uVar13 = uVar9;
    } while (uVar9 != uVar10);
    if (uVar10 != 0) {
      lVar5 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      ;
      do {
        uVar13 = uVar10 - 1;
        dVar14 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data[lVar5 * uVar13 + (uVar10 - 1)];
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        pdVar8 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar5 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
        pdVar8[lVar5 * uVar13 + uVar13] = dVar14;
        puVar1 = (model->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar11 = puVar1[uVar10];
        uVar6 = uVar11;
        if (uVar11 != 0) {
          do {
            lVar12 = (ulong)(uVar6 - 1) * lVar5;
            pdVar8[uVar13 + lVar12] = pdVar8[uVar13 + lVar12] / pdVar8[lVar5 * uVar13 + uVar13];
            uVar10 = (ulong)uVar6;
            uVar6 = puVar1[uVar10];
          } while (puVar1[uVar10] != 0);
          for (; uVar11 != 0; uVar11 = puVar1[uVar11]) {
            uVar10 = (ulong)(uVar11 - 1);
            uVar6 = uVar11;
            do {
              lVar12 = (ulong)(uVar6 - 1) * lVar5;
              pdVar8[lVar12 + uVar10] =
                   pdVar8[lVar12 + uVar10] -
                   pdVar8[uVar13 + lVar5 * uVar10] * pdVar8[lVar12 + uVar13];
              uVar6 = puVar1[uVar6];
            } while (uVar6 != 0);
          }
        }
        uVar10 = uVar13;
      } while (uVar13 != 0);
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void SparseFactorizeLTL (Model &model, Math::MatrixNd &H) {
  for (unsigned int i = 0; i < model.qdot_size; i++) {
    for (unsigned int j = i + 1; j < model.qdot_size; j++) {
      H(i,j) = 0.;
    }
  }

  for (unsigned int k = model.qdot_size; k > 0; k--) {
    H(k - 1,k - 1) = sqrt (H(k - 1,k - 1));
    unsigned int i = model.lambda_q[k];
    while (i != 0) {
      H(k - 1,i - 1) = H(k - 1,i - 1) / H(k - 1,k - 1);
      i = model.lambda_q[i];
    }

    i = model.lambda_q[k];
    while (i != 0) {
      unsigned int j = i;
      while (j != 0) {
        H(i - 1,j - 1) = H(i - 1,j - 1) - H(k - 1,i - 1) * H(k - 1, j - 1);
        j = model.lambda_q[j];
      }
      i = model.lambda_q[i];
    }
  }
}